

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

FState * __thiscall
FStateLabelStorage::GetState(FStateLabelStorage *this,int pos,PClassActor *cls,bool exact)

{
  FName *names;
  FState *pFVar1;
  FState *pFVar2;
  FName local_4;
  
  if (pos < 0x10000001) {
    if (pos < 0) {
      if ((PClassActor *)AActor::RegistrationInfo.MyClass != cls) {
        pFVar2 = *(FState **)((this->Storage).Array + ((ulong)(uint)pos & 0xffff) * 4);
        while ((pFVar2 < cls->OwnedStates ||
               (pFVar1 = cls->OwnedStates + cls->NumOwnedStates, pFVar1 <= pFVar2))) {
          cls = (PClassActor *)(cls->super_PClass).ParentClass;
          if (cls == (PClassActor *)AActor::RegistrationInfo.MyClass) {
            return (FState *)0x0;
          }
        }
        if (pFVar1 <= pFVar2 + ((uint)pos >> 0x10 & 0x7fff)) {
          return (FState *)0x0;
        }
        return pFVar2 + ((uint)pos >> 0x10 & 0x7fff);
      }
    }
    else if (pos != 0) {
      names = (FName *)((this->Storage).Array + (ulong)(uint)pos * 4);
      if (names[-1].Index == 0) {
        return *(FState **)names;
      }
      if (cls != (PClassActor *)0x0) {
        pFVar2 = PClassActor::FindState(cls,names[-1].Index,names,exact);
        return pFVar2;
      }
    }
  }
  else if (cls != (PClassActor *)0x0) {
    pFVar2 = PClassActor::FindState(cls,1,&local_4,false);
    return pFVar2;
  }
  return (FState *)0x0;
}

Assistant:

FState *FStateLabelStorage::GetState(int pos, PClassActor *cls, bool exact)
{
	if (pos > 0x10000000)
	{
		return cls? cls->FindState(ENamedName(pos - 0x10000000)) : nullptr;
	}
	else if (pos < 0)
	{
		// decode the combined value produced by the script.
		int index = (pos >> 16) & 32767;
		pos = ((pos & 65535) - 1) * 4;
		FState *state;
		memcpy(&state, &Storage[pos + sizeof(int)], sizeof(state));
		if (VerifyJumpTarget(cls, state, index))
			return state + index;
		else
			return nullptr;
	}
	else if (pos > 0)
	{
		int val;
		pos = (pos - 1) * 4;
		memcpy(&val, &Storage[pos], sizeof(int));

		if (val == 0)
		{
			FState *state;
			memcpy(&state, &Storage[pos + sizeof(int)], sizeof(state));
			return state;
		}
		else if (cls != nullptr)
		{
			FName *labels = (FName*)&Storage[pos + sizeof(int)];
			return cls->FindState(val, labels, exact);
		}
	}
	return nullptr;
}